

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferErrors.cpp
# Opt level: O1

GLboolean __thiscall
glcts::TextureBufferErrors::verifyError
          (TextureBufferErrors *this,GLenum expected_error,char *description)

{
  GLboolean GVar1;
  int iVar2;
  GLenum GVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined1 local_198 [8];
  _func_int **local_190;
  ios_base local_120 [264];
  
  iVar2 = (*((this->super_TestCaseBase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  GVar3 = (**(code **)(CONCAT44(extraout_var,iVar2) + 0x800))();
  GVar1 = '\x01';
  if (GVar3 != expected_error) {
    local_198 = (undefined1  [8])
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
    if (description == (char *)0x0) {
      std::ios::clear((int)(ostringstream *)&local_190 + (int)local_190[-3]);
    }
    else {
      sVar4 = strlen(description);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_190,description,sVar4);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
    std::ios_base::~ios_base(local_120);
    GVar1 = '\0';
  }
  return GVar1;
}

Assistant:

glw::GLboolean TextureBufferErrors::verifyError(const glw::GLenum expected_error, const char* description)
{
	/* Retrieve GLES entry points. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLboolean test_passed = true;
	glw::GLenum	error_code  = gl.getError();

	if (error_code != expected_error)
	{
		test_passed = false;

		m_testCtx.getLog() << tcu::TestLog::Message << description << tcu::TestLog::EndMessage;
	}

	return test_passed;
}